

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

int64_t __thiscall
icu_63::RegexMatcher::start64(RegexMatcher *this,int32_t group,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int64_t iStack_30;
  int32_t groupOffset;
  int64_t s;
  UErrorCode *status_local;
  int32_t group_local;
  RegexMatcher *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = ::U_FAILURE(this->fDeferredStatus);
    if (UVar1 == '\0') {
      if (this->fMatch == '\0') {
        *status = U_REGEX_INVALID_STATE;
      }
      else {
        if ((-1 < group) && (iVar2 = UVector32::size(this->fPattern->fGroupMap), group <= iVar2)) {
          if (group == 0) {
            iStack_30 = this->fMatchStart;
          }
          else {
            iVar2 = UVector32::elementAti(this->fPattern->fGroupMap,group + -1);
            iStack_30 = this->fFrame->fExtra[iVar2];
          }
          return iStack_30;
        }
        *status = U_INDEX_OUTOFBOUNDS_ERROR;
      }
    }
    else {
      *status = this->fDeferredStatus;
    }
  }
  return -1;
}

Assistant:

int64_t RegexMatcher::start64(int32_t group, UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return -1;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return -1;
    }
    if (fMatch == FALSE) {
        status = U_REGEX_INVALID_STATE;
        return -1;
    }
    if (group < 0 || group > fPattern->fGroupMap->size()) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
        return -1;
    }
    int64_t s;
    if (group == 0) {
        s = fMatchStart;
    } else {
        int32_t groupOffset = fPattern->fGroupMap->elementAti(group-1);
        U_ASSERT(groupOffset < fPattern->fFrameSize);
        U_ASSERT(groupOffset >= 0);
        s = fFrame->fExtra[groupOffset];
    }

    return s;
}